

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_ManyArgs_Test::TestBody(FormatterTest_ManyArgs_Test *this)

{
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  bool bVar1;
  AssertHelper *this_00;
  format_error *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_3;
  string format_str;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_2;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  char (*in_stack_fffffffffffffcd8) [3];
  char *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  char *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  Type in_stack_fffffffffffffcfc;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  char (*in_stack_fffffffffffffd08) [7];
  allocator *paVar2;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  allocator *in_stack_fffffffffffffd50;
  string local_200 [38];
  byte local_1da;
  allocator local_1d9;
  string local_1d8 [32];
  AssertionResult local_1b8;
  undefined4 local_1a4;
  string local_1a0 [80];
  string local_150 [38];
  byte local_12a;
  allocator local_129;
  string local_128 [32];
  AssertionResult local_108 [3];
  int local_d4;
  string local_c0 [38];
  byte local_9a;
  allocator local_99;
  string local_98 [32];
  AssertionResult local_78 [4];
  string local_38 [32];
  AssertionResult local_18;
  
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8)
  ;
  format_str_00.size_._0_4_ = in_stack_fffffffffffffce8;
  format_str_00.data_ = in_stack_fffffffffffffce0;
  format_str_00.size_._4_4_ = in_stack_fffffffffffffcec;
  TestFormat<20>::format<>(format_str_00);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::AssertionResult::failure_message((AssertionResult *)0x132484);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
               in_stack_fffffffffffffce0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd50,
               (Message *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x1324e7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13253f);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"argument index out of range",&local_99);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    local_9a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)in_stack_fffffffffffffcd0,
                 (char *)in_stack_fffffffffffffcc8);
      format_str_01.size_._0_4_ = in_stack_fffffffffffffce8;
      format_str_01.data_ = in_stack_fffffffffffffce0;
      format_str_01.size_._4_4_ = in_stack_fffffffffffffcec;
      TestFormat<20>::format<>(format_str_01);
      std::__cxx11::string::~string(local_c0);
    }
    if ((local_9a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      local_d4 = 2;
    }
    else {
      local_d4 = 0;
    }
    std::__cxx11::string::~string(local_98);
    if (local_d4 != 0) goto LAB_001328f1;
  }
  else {
LAB_001328f1:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::AssertionResult::failure_message((AssertionResult *)0x13290d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
               in_stack_fffffffffffffce0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd50,
               (Message *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x132970);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1329c8);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
  if (bVar1) {
    in_stack_fffffffffffffd50 = &local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"argument index out of range",in_stack_fffffffffffffd50);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    local_12a = 0;
    in_stack_fffffffffffffd4f = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffd4f) {
      fmt::v5::basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)in_stack_fffffffffffffcd0,
                 (char *)in_stack_fffffffffffffcc8);
      format_str_02.size_._0_4_ = in_stack_fffffffffffffce8;
      format_str_02.data_ = in_stack_fffffffffffffce0;
      format_str_02.size_._4_4_ = in_stack_fffffffffffffcec;
      TestFormat<21>::format<>(format_str_02);
      std::__cxx11::string::~string(local_150);
    }
    if ((local_12a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                 (char (*) [112])CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      local_d4 = 3;
    }
    else {
      local_d4 = 0;
    }
    std::__cxx11::string::~string(local_128);
    if (local_d4 != 0) goto LAB_00132d5c;
  }
  else {
LAB_00132d5c:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::AssertionResult::failure_message((AssertionResult *)0x132d78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
               in_stack_fffffffffffffce0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffd50,
               (Message *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x132dd5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x132e2d);
  local_1a4 = 0x10;
  fmt::v5::format<char[7],int>
            (in_stack_fffffffffffffd08,
             (int *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
  if (bVar1) {
    paVar2 = &local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"argument index out of range",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    local_1da = 0;
    in_stack_fffffffffffffd07 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffd07) {
      fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
                ((basic_string_view<char> *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      format_str_03.size_._0_4_ = in_stack_fffffffffffffce8;
      format_str_03.data_ = in_stack_fffffffffffffce0;
      format_str_03.size_._4_4_ = in_stack_fffffffffffffcec;
      TestFormat<15>::format<>(format_str_03);
      std::__cxx11::string::~string(local_200);
    }
    if ((local_1da & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                 (char (*) [129])CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      local_d4 = 4;
    }
    else {
      local_d4 = 0;
    }
    std::__cxx11::string::~string(local_1d8);
    if (local_d4 == 0) goto LAB_001332a3;
  }
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1331fe);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
             in_stack_fffffffffffffce0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffffd50,
             (Message *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x13325b);
LAB_001332a3:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1332b0);
  std::__cxx11::string::~string(local_1a0);
  return;
}

Assistant:

TEST(FormatterTest, ManyArgs) {
  EXPECT_EQ("19", TestFormat<20>::format("{19}"));
  EXPECT_THROW_MSG(TestFormat<20>::format("{20}"),
                   format_error, "argument index out of range");
  EXPECT_THROW_MSG(TestFormat<21>::format("{21}"),
                   format_error, "argument index out of range");
  enum { max_packed_args = fmt::internal::max_packed_args };
  std::string format_str = fmt::format("{{{}}}", max_packed_args + 1);
  EXPECT_THROW_MSG(TestFormat<max_packed_args>::format(format_str),
                   format_error, "argument index out of range");
}